

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_display_graphic_char(Terminal *term,unsigned_long c)

{
  pos pVar1;
  wchar_t wVar2;
  termline *line;
  termchar *ptVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint ucs;
  bool bVar7;
  
  line = lineptr(term,(term->curs).y,L'ಘ',L'\x01');
  ucs = (uint)c;
  if ((ucs & 0xfffffc00) == 0xd800) {
    wVar6 = (wchar_t)((ucs & 0xfffffc00) == 0xd800);
  }
  else if (term->cjk_ambig_wide == true) {
    wVar6 = mk_wcwidth_cjk(ucs);
  }
  else {
    wVar6 = mk_wcwidth(ucs);
  }
  if (((term->wrapnext == true) && (term->wrap == true)) && (L'\0' < wVar6)) {
    *(byte *)&line->lattr = (byte)line->lattr | 0x10;
    wVar2 = (term->curs).y;
    if (wVar2 == term->marg_b) {
      scroll(term,term->marg_t,term->marg_b,L'\x01',true);
    }
    else if (wVar2 < term->rows + L'\xffffffff') {
      (term->curs).y = wVar2 + L'\x01';
    }
    (term->curs).x = L'\0';
    term->wrapnext = false;
    line = lineptr(term,(term->curs).y,L'ಧ',L'\x01');
  }
  if ((term->insert == true) && (L'\0' < wVar6)) {
    insch(term,wVar6);
  }
  if (term->selstate != LEXICOGRAPHIC) {
    pVar1 = term->curs;
    wVar4 = pVar1.x;
    wVar2 = pVar1.y;
    wVar5 = (term->selend).y;
    bVar7 = wVar4 < (term->selend).x;
    if (wVar2 != wVar5) {
      bVar7 = wVar2 < wVar5;
    }
    if (bVar7) {
      bVar7 = term->cols == wVar4;
      wVar4 = (wchar_t)((ulong)((long)pVar1 + 0x100000000) >> 0x20);
      if (bVar7) {
        wVar4 = L'\0';
      }
      wVar2 = wVar2 + (uint)bVar7;
      wVar5 = (term->selstart).y;
      bVar7 = wVar5 < wVar2;
      if (wVar5 == wVar2) {
        bVar7 = (term->selstart).x < wVar4;
      }
      if (bVar7) {
        term->selstate = LEXICOGRAPHIC;
        (term->selstart).y = L'\0';
        (term->selstart).x = L'\0';
        (term->selend).y = L'\0';
        (term->selend).x = L'\0';
      }
    }
  }
  if ((((ucs & 0xffffff00) == 0xd800) || ((c & 0xffffff00) == 0)) &&
     (term->logctx != (LogContext *)0x0)) {
    logtraffic(term->logctx,(uchar)c,1);
  }
  if (line->trusted != term->trusted) {
    clear_line(term,line);
    line->trusted = term->trusted;
  }
  wVar2 = term->cols + L'\xfffffffd';
  if (line->trusted == false) {
    wVar2 = term->cols;
  }
  if (wVar6 == L'\x02' && L'\x01' >= wVar2) {
    c = 0xfffd;
  }
  wVar4 = L'\x01';
  if (wVar6 != L'\x02' || L'\x01' < wVar2) {
    wVar4 = wVar6;
  }
  if (wVar4 == L'\0') {
    wVar6 = (term->curs).x;
    if (wVar6 < L'\x01') {
      return;
    }
    wVar6 = wVar6 - (term->wrapnext ^ 1);
    if (line->chars[(uint)wVar6].chr == 0xdfff) {
      if (wVar6 < L'\x01') {
        __assert_fail("x > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0xd11,"void term_display_graphic_char(Terminal *, unsigned long)");
      }
      wVar6 = wVar6 + L'\xffffffff';
    }
    add_cc(line,wVar6,c);
  }
  else {
    if (wVar4 == L'\x01') {
      check_boundary(term,(term->curs).x,(term->curs).y);
      check_boundary(term,(term->curs).x + L'\x01',(term->curs).y);
      clear_cc(line,(term->curs).x);
      ptVar3 = line->chars + (term->curs).x;
      ptVar3->chr = c;
    }
    else {
      if (wVar4 != L'\x02') {
        return;
      }
      check_boundary(term,(term->curs).x,(term->curs).y);
      check_boundary(term,(term->curs).x + L'\x02',(term->curs).y);
      wVar6 = (term->curs).x;
      if (wVar2 + L'\xffffffff' <= wVar6) {
        copy_termchar(line,wVar6,&term->erase_char);
        *(byte *)&line->lattr = (byte)line->lattr | 0x30;
        wVar6 = (term->curs).y;
        if (wVar6 == term->marg_b) {
          scroll(term,term->marg_t,term->marg_b,L'\x01',true);
        }
        else if (wVar6 < term->rows + L'\xffffffff') {
          (term->curs).y = wVar6 + L'\x01';
        }
        (term->curs).x = L'\0';
        line = lineptr(term,(term->curs).y,L'ೠ',L'\x01');
        check_boundary(term,(term->curs).x,(term->curs).y);
        check_boundary(term,(term->curs).x + L'\x02',(term->curs).y);
      }
      clear_cc(line,(term->curs).x);
      ptVar3 = line->chars;
      wVar6 = (term->curs).x;
      ptVar3[wVar6].chr = c;
      ptVar3[wVar6].attr = (long)term->curr_attr;
      ptVar3[wVar6].truecolour = term->curr_truecolour;
      wVar6 = (term->curs).x + L'\x01';
      (term->curs).x = wVar6;
      clear_cc(line,wVar6);
      ptVar3 = line->chars + (term->curs).x;
      ptVar3->chr = 0xdfff;
    }
    ptVar3->attr = (long)term->curr_attr;
    ptVar3->truecolour = term->curr_truecolour;
    wVar6 = (term->curs).x + L'\x01';
    (term->curs).x = wVar6;
    if (wVar2 <= wVar6) {
      (term->curs).x = wVar2 + L'\xffffffff';
      term->wrapnext = true;
      if ((term->wrap == true) && (term->vt52_mode == true)) {
        *(byte *)&line->lattr = (byte)line->lattr | 0x10;
        wVar6 = (term->curs).y;
        if (wVar6 == term->marg_b) {
          scroll(term,term->marg_t,term->marg_b,L'\x01',true);
        }
        else if (wVar6 < term->rows + L'\xffffffff') {
          (term->curs).y = wVar6 + L'\x01';
        }
        (term->curs).x = L'\0';
        term->wrapnext = false;
      }
    }
  }
  term->seen_disp_event = true;
  if (term->window_update_pending != false) {
    return;
  }
  term->window_update_pending = true;
  queue_toplevel_callback(term_update_callback,term);
  return;
}

Assistant:

static void term_display_graphic_char(Terminal *term, unsigned long c)
{
    termline *cline = scrlineptr(term->curs.y);
    int width = 0;
    if (DIRECT_CHAR(c))
        width = 1;
    if (!width)
        width = term_char_width(term, c);

    if (term->wrapnext && term->wrap && width > 0) {
        cline->lattr |= LATTR_WRAPPED;
        if (term->curs.y == term->marg_b)
            scroll(term, term->marg_t, term->marg_b, 1, true);
        else if (term->curs.y < term->rows - 1)
            term->curs.y++;
        term->curs.x = 0;
        term->wrapnext = false;
        cline = scrlineptr(term->curs.y);
    }
    if (term->insert && width > 0)
        insch(term, width);
    if (term->selstate != NO_SELECTION) {
        pos cursplus = term->curs;
        incpos(cursplus);
        check_selection(term, term->curs, cursplus);
    }
    if (((c & CSET_MASK) == CSET_ASCII ||
         (c & CSET_MASK) == 0) && term->logctx)
        logtraffic(term->logctx, (unsigned char) c, LGTYP_ASCII);

    check_trust_status(term, cline);

    int linecols = term->cols;
    if (cline->trusted)
        linecols -= TRUST_SIGIL_WIDTH;

    /*
     * Preliminary check: if the terminal is only one character cell
     * wide, then we cannot display any double-width character at all.
     * Substitute single-width REPLACEMENT CHARACTER instead.
     */
    if (width == 2 && linecols < 2) {
        width = 1;
        c = 0xFFFD;
    }

    switch (width) {
      case 2:
        /*
         * If we're about to display a double-width character starting
         * in the rightmost column, then we do something special
         * instead. We must print a space in the last column of the
         * screen, then wrap; and we also set LATTR_WRAPPED2 which
         * instructs subsequent cut-and-pasting not only to splice
         * this line to the one after it, but to ignore the space in
         * the last character position as well. (Because what was
         * actually output to the terminal was presumably just a
         * sequence of CJK characters, and we don't want a space to be
         * pasted in the middle of those just because they had the
         * misfortune to start in the wrong parity column. xterm
         * concurs.)
         */
        check_boundary(term, term->curs.x, term->curs.y);
        check_boundary(term, term->curs.x+2, term->curs.y);
        if (term->curs.x >= linecols-1) {
            copy_termchar(cline, term->curs.x,
                          &term->erase_char);
            cline->lattr |= LATTR_WRAPPED | LATTR_WRAPPED2;
            if (term->curs.y == term->marg_b)
                scroll(term, term->marg_t, term->marg_b,
                       1, true);
            else if (term->curs.y < term->rows - 1)
                term->curs.y++;
            term->curs.x = 0;
            cline = scrlineptr(term->curs.y);
            /* Now we must check_boundary again, of course. */
            check_boundary(term, term->curs.x, term->curs.y);
            check_boundary(term, term->curs.x+2, term->curs.y);
        }

        /* FULL-TERMCHAR */
        clear_cc(cline, term->curs.x);
        cline->chars[term->curs.x].chr = c;
        cline->chars[term->curs.x].attr = term->curr_attr;
        cline->chars[term->curs.x].truecolour =
            term->curr_truecolour;

        term->curs.x++;

        /* FULL-TERMCHAR */
        clear_cc(cline, term->curs.x);
        cline->chars[term->curs.x].chr = UCSWIDE;
        cline->chars[term->curs.x].attr = term->curr_attr;
        cline->chars[term->curs.x].truecolour =
            term->curr_truecolour;

        break;
      case 1:
        check_boundary(term, term->curs.x, term->curs.y);
        check_boundary(term, term->curs.x+1, term->curs.y);

        /* FULL-TERMCHAR */
        clear_cc(cline, term->curs.x);
        cline->chars[term->curs.x].chr = c;
        cline->chars[term->curs.x].attr = term->curr_attr;
        cline->chars[term->curs.x].truecolour =
            term->curr_truecolour;

        break;
      case 0:
        if (term->curs.x > 0) {
            int x = term->curs.x - 1;

            /* If we're in wrapnext state, the character to combine
             * with is _here_, not to our left. */
            if (term->wrapnext)
                x++;

            /*
             * If the previous character is UCSWIDE, back up another
             * one.
             */
            if (cline->chars[x].chr == UCSWIDE) {
                assert(x > 0);
                x--;
            }

            add_cc(cline, x, c);
            seen_disp_event(term);
        }
        return;
      default:
        return;
    }
    term->curs.x++;
    if (term->curs.x >= linecols) {
        term->curs.x = linecols - 1;
        term->wrapnext = true;
        if (term->wrap && term->vt52_mode) {
            cline->lattr |= LATTR_WRAPPED;
            if (term->curs.y == term->marg_b)
                scroll(term, term->marg_t, term->marg_b, 1, true);
            else if (term->curs.y < term->rows - 1)
                term->curs.y++;
            term->curs.x = 0;
            term->wrapnext = false;
        }
    }
    seen_disp_event(term);
}